

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_builder.c
# Opt level: O0

int gen_builder_struct_field_assign
              (fb_output_t *out,fb_compound_type_t *ct,int index,int arg_count,int conversion,
              int from_ptr)

{
  int iVar1;
  char *in_stack_fffffffffffffe48;
  undefined4 uVar2;
  char *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  int local_18c;
  int local_184;
  undefined1 auStack_158 [8];
  fb_scoped_name_t snref;
  char *tprefix;
  char *kind;
  char *pcStack_58;
  int deprecated_index;
  char *s;
  int len;
  int n;
  fb_symbol_t *sym;
  fb_member_t *member;
  char *nsc;
  int from_ptr_local;
  int conversion_local;
  int arg_count_local;
  int index_local;
  fb_compound_type_t *ct_local;
  fb_output_t *out_local;
  
  kind._4_4_ = 0;
  snref.text[200] = '\0';
  snref.text[0xc9] = '\0';
  snref.text[0xca] = '\0';
  snref.text[0xcb] = '\0';
  snref._204_4_ = 0;
  snref.scope = (fb_scope_t *)0x0;
  snref.text[0xb8] = '\0';
  snref.text[0xb9] = '\0';
  snref.text[0xba] = '\0';
  snref.text[0xbb] = '\0';
  snref.text[0xbc] = '\0';
  snref.text[0xbd] = '\0';
  snref.text[0xbe] = '\0';
  snref.text[0xbf] = '\0';
  snref.text[0xc0] = '\0';
  snref.text[0xc1] = '\0';
  snref.text[0xc2] = '\0';
  snref.text[0xc3] = '\0';
  snref.text[0xc4] = '\0';
  snref.text[0xc5] = '\0';
  snref.text[0xc6] = '\0';
  snref.text[199] = '\0';
  snref.text[0xa8] = '\0';
  snref.text[0xa9] = '\0';
  snref.text[0xaa] = '\0';
  snref.text[0xab] = '\0';
  snref.text[0xac] = '\0';
  snref.text[0xad] = '\0';
  snref.text[0xae] = '\0';
  snref.text[0xaf] = '\0';
  snref.text[0xb0] = '\0';
  snref.text[0xb1] = '\0';
  snref.text[0xb2] = '\0';
  snref.text[0xb3] = '\0';
  snref.text[0xb4] = '\0';
  snref.text[0xb5] = '\0';
  snref.text[0xb6] = '\0';
  snref.text[0xb7] = '\0';
  snref.text[0x98] = '\0';
  snref.text[0x99] = '\0';
  snref.text[0x9a] = '\0';
  snref.text[0x9b] = '\0';
  snref.text[0x9c] = '\0';
  snref.text[0x9d] = '\0';
  snref.text[0x9e] = '\0';
  snref.text[0x9f] = '\0';
  snref.text[0xa0] = '\0';
  snref.text[0xa1] = '\0';
  snref.text[0xa2] = '\0';
  snref.text[0xa3] = '\0';
  snref.text[0xa4] = '\0';
  snref.text[0xa5] = '\0';
  snref.text[0xa6] = '\0';
  snref.text[0xa7] = '\0';
  snref.text[0x88] = '\0';
  snref.text[0x89] = '\0';
  snref.text[0x8a] = '\0';
  snref.text[0x8b] = '\0';
  snref.text[0x8c] = '\0';
  snref.text[0x8d] = '\0';
  snref.text[0x8e] = '\0';
  snref.text[0x8f] = '\0';
  snref.text[0x90] = '\0';
  snref.text[0x91] = '\0';
  snref.text[0x92] = '\0';
  snref.text[0x93] = '\0';
  snref.text[0x94] = '\0';
  snref.text[0x95] = '\0';
  snref.text[0x96] = '\0';
  snref.text[0x97] = '\0';
  snref.text[0x78] = '\0';
  snref.text[0x79] = '\0';
  snref.text[0x7a] = '\0';
  snref.text[0x7b] = '\0';
  snref.text[0x7c] = '\0';
  snref.text[0x7d] = '\0';
  snref.text[0x7e] = '\0';
  snref.text[0x7f] = '\0';
  snref.text[0x80] = '\0';
  snref.text[0x81] = '\0';
  snref.text[0x82] = '\0';
  snref.text[0x83] = '\0';
  snref.text[0x84] = '\0';
  snref.text[0x85] = '\0';
  snref.text[0x86] = '\0';
  snref.text[0x87] = '\0';
  snref.text[0x68] = '\0';
  snref.text[0x69] = '\0';
  snref.text[0x6a] = '\0';
  snref.text[0x6b] = '\0';
  snref.text[0x6c] = '\0';
  snref.text[0x6d] = '\0';
  snref.text[0x6e] = '\0';
  snref.text[0x6f] = '\0';
  snref.text[0x70] = '\0';
  snref.text[0x71] = '\0';
  snref.text[0x72] = '\0';
  snref.text[0x73] = '\0';
  snref.text[0x74] = '\0';
  snref.text[0x75] = '\0';
  snref.text[0x76] = '\0';
  snref.text[0x77] = '\0';
  snref.text[0x58] = '\0';
  snref.text[0x59] = '\0';
  snref.text[0x5a] = '\0';
  snref.text[0x5b] = '\0';
  snref.text[0x5c] = '\0';
  snref.text[0x5d] = '\0';
  snref.text[0x5e] = '\0';
  snref.text[0x5f] = '\0';
  snref.text[0x60] = '\0';
  snref.text[0x61] = '\0';
  snref.text[0x62] = '\0';
  snref.text[99] = '\0';
  snref.text[100] = '\0';
  snref.text[0x65] = '\0';
  snref.text[0x66] = '\0';
  snref.text[0x67] = '\0';
  snref.text[0x48] = '\0';
  snref.text[0x49] = '\0';
  snref.text[0x4a] = '\0';
  snref.text[0x4b] = '\0';
  snref.text[0x4c] = '\0';
  snref.text[0x4d] = '\0';
  snref.text[0x4e] = '\0';
  snref.text[0x4f] = '\0';
  snref.text[0x50] = '\0';
  snref.text[0x51] = '\0';
  snref.text[0x52] = '\0';
  snref.text[0x53] = '\0';
  snref.text[0x54] = '\0';
  snref.text[0x55] = '\0';
  snref.text[0x56] = '\0';
  snref.text[0x57] = '\0';
  snref.text[0x38] = '\0';
  snref.text[0x39] = '\0';
  snref.text[0x3a] = '\0';
  snref.text[0x3b] = '\0';
  snref.text[0x3c] = '\0';
  snref.text[0x3d] = '\0';
  snref.text[0x3e] = '\0';
  snref.text[0x3f] = '\0';
  snref.text[0x40] = '\0';
  snref.text[0x41] = '\0';
  snref.text[0x42] = '\0';
  snref.text[0x43] = '\0';
  snref.text[0x44] = '\0';
  snref.text[0x45] = '\0';
  snref.text[0x46] = '\0';
  snref.text[0x47] = '\0';
  snref.text[0x28] = '\0';
  snref.text[0x29] = '\0';
  snref.text[0x2a] = '\0';
  snref.text[0x2b] = '\0';
  snref.text[0x2c] = '\0';
  snref.text[0x2d] = '\0';
  snref.text[0x2e] = '\0';
  snref.text[0x2f] = '\0';
  snref.text[0x30] = '\0';
  snref.text[0x31] = '\0';
  snref.text[0x32] = '\0';
  snref.text[0x33] = '\0';
  snref.text[0x34] = '\0';
  snref.text[0x35] = '\0';
  snref.text[0x36] = '\0';
  snref.text[0x37] = '\0';
  snref.text[0x18] = '\0';
  snref.text[0x19] = '\0';
  snref.text[0x1a] = '\0';
  snref.text[0x1b] = '\0';
  snref.text[0x1c] = '\0';
  snref.text[0x1d] = '\0';
  snref.text[0x1e] = '\0';
  snref.text[0x1f] = '\0';
  snref.text[0x20] = '\0';
  snref.text[0x21] = '\0';
  snref.text[0x22] = '\0';
  snref.text[0x23] = '\0';
  snref.text[0x24] = '\0';
  snref.text[0x25] = '\0';
  snref.text[0x26] = '\0';
  snref.text[0x27] = '\0';
  snref.text[8] = '\0';
  snref.text[9] = '\0';
  snref.text[10] = '\0';
  snref.text[0xb] = '\0';
  snref.text[0xc] = '\0';
  snref.text[0xd] = '\0';
  snref.text[0xe] = '\0';
  snref.text[0xf] = '\0';
  snref.text[0x10] = '\0';
  snref.text[0x11] = '\0';
  snref.text[0x12] = '\0';
  snref.text[0x13] = '\0';
  snref.text[0x14] = '\0';
  snref.text[0x15] = '\0';
  snref.text[0x16] = '\0';
  snref.text[0x17] = '\0';
  auStack_158[0] = '\0';
  auStack_158[1] = '\0';
  auStack_158[2] = '\0';
  auStack_158[3] = '\0';
  auStack_158[4] = '\0';
  auStack_158[5] = '\0';
  auStack_158[6] = '\0';
  auStack_158[7] = '\0';
  snref.text[0] = '\0';
  snref.text[1] = '\0';
  snref.text[2] = '\0';
  snref.text[3] = '\0';
  snref.text[4] = '\0';
  snref.text[5] = '\0';
  snref.text[6] = '\0';
  snref.text[7] = '\0';
  snref.scope_len = 0;
  snref.len = 0;
  if (conversion == 1) {
    tprefix = "_from_pe";
  }
  else if (conversion == 2) {
    tprefix = "_to_pe";
  }
  else {
    tprefix = "";
  }
  _len = ct->members;
  member = (fb_member_t *)out;
  nsc._0_4_ = from_ptr;
  nsc._4_4_ = conversion;
  from_ptr_local = arg_count;
  conversion_local = index;
  _arg_count_local = ct;
  ct_local = (fb_compound_type_t *)out;
  do {
    if (_len == (fb_symbol_t *)0x0) {
      if (0 < from_ptr_local) {
        fprintf((FILE *)ct_local->export_index,";\n  ");
      }
      return conversion_local;
    }
    sym = _len;
    symbol_name(_len,(int *)((long)&s + 4),&stack0xffffffffffffffa8);
    if (0 < conversion_local) {
      if (conversion_local % 4 == 0) {
        fprintf((FILE *)ct_local->export_index,";\n  ");
      }
      else {
        fprintf((FILE *)ct_local->export_index,"; ");
      }
    }
    switch(sym[1].kind) {
    case 9:
      snref._224_8_ = scalar_type_prefix(*(fb_scalar_type_t *)&sym[1].link);
      if ((sym[4].kind & 4) == 0) {
        if (sym[5].ident == (fb_token_t *)&DAT_00000001) {
          local_18c = 0;
        }
        else {
          local_18c = nsc._4_4_;
        }
        uVar2 = (undefined4)((ulong)in_stack_fffffffffffffe48 >> 0x20);
        if (local_18c == 1) {
          if ((int)nsc == 0) {
            in_stack_fffffffffffffe48 = (char *)CONCAT44(uVar2,conversion_local);
            fprintf((FILE *)ct_local->export_index,"%s%s_assign_from_pe(&p->%.*s, v%i)",member,
                    snref._224_8_,(ulong)s._4_4_,pcStack_58,in_stack_fffffffffffffe48);
          }
          else {
            in_stack_fffffffffffffe48 = (char *)CONCAT44(uVar2,s._4_4_);
            in_stack_fffffffffffffe50 = pcStack_58;
            fprintf((FILE *)ct_local->export_index,"%s%s_copy_from_pe(&p->%.*s, &p2->%.*s)",member,
                    snref._224_8_,(ulong)s._4_4_,pcStack_58,in_stack_fffffffffffffe48,pcStack_58);
          }
        }
        else if (local_18c == 2) {
          if ((int)nsc == 0) {
            in_stack_fffffffffffffe48 = (char *)CONCAT44(uVar2,conversion_local);
            fprintf((FILE *)ct_local->export_index,"%s%s_assign_to_pe(&p->%.*s, v%i)",member,
                    snref._224_8_,(ulong)s._4_4_,pcStack_58,in_stack_fffffffffffffe48);
          }
          else {
            in_stack_fffffffffffffe48 = (char *)CONCAT44(uVar2,s._4_4_);
            in_stack_fffffffffffffe50 = pcStack_58;
            fprintf((FILE *)ct_local->export_index,"%s%s_copy_to_pe(&p->%.*s, &p2->%.*s)",member,
                    snref._224_8_,(ulong)s._4_4_,pcStack_58,in_stack_fffffffffffffe48,pcStack_58);
          }
        }
        else if ((int)nsc == 0) {
          fprintf((FILE *)ct_local->export_index,"p->%.*s = v%i",(ulong)s._4_4_,pcStack_58,
                  (ulong)(uint)conversion_local);
        }
        else {
          fprintf((FILE *)ct_local->export_index,"p->%.*s = p2->%.*s",(ulong)s._4_4_,pcStack_58,
                  (ulong)s._4_4_,pcStack_58);
        }
LAB_0010f560:
        conversion_local = conversion_local + 1;
      }
      else {
        fprintf((FILE *)ct_local->export_index,"__%sstruct_clear_field(p->__deprecated%i)",member,
                (ulong)kind._4_4_);
        kind._4_4_ = kind._4_4_ + 1;
        conversion_local = conversion_local + 1;
      }
      break;
    default:
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_builder.c"
              ,0x4ad,"internal error: type error");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_builder.c"
                    ,0x4ad,
                    "int gen_builder_struct_field_assign(fb_output_t *, fb_compound_type_t *, int, int, int, int)"
                   );
    case 0xf:
      fb_compound_name((fb_compound_type_t *)sym[1].link,(fb_scoped_name_t *)auStack_158);
      if ((sym[1].link)->kind == 1) {
        if ((sym[4].kind & 4) == 0) {
          if ((int)nsc == 0) {
            fprintf((FILE *)ct_local->export_index,"%s_assign%s(&p->%.*s",auStack_158,tprefix,
                    (ulong)s._4_4_,pcStack_58);
            conversion_local =
                 gen_builder_struct_call_list
                           ((fb_output_t *)ct_local,(fb_compound_type_t *)sym[1].link,
                            conversion_local,from_ptr_local,0);
            fprintf((FILE *)ct_local->export_index,")");
          }
          else {
            in_stack_fffffffffffffe48 =
                 (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffe48 >> 0x20),s._4_4_);
            in_stack_fffffffffffffe50 = pcStack_58;
            fprintf((FILE *)ct_local->export_index,"%s_copy%s(&p->%.*s, &p2->%.*s)",auStack_158,
                    tprefix,(ulong)s._4_4_,pcStack_58,in_stack_fffffffffffffe48,pcStack_58);
            conversion_local = conversion_local + 1;
          }
        }
        else {
          fprintf((FILE *)ct_local->export_index,"__%sstruct_clear_field(p->__deprecated%i)",member,
                  (ulong)kind._4_4_);
          kind._4_4_ = kind._4_4_ + 1;
          iVar1 = get_total_struct_field_count((fb_compound_type_t *)sym[1].link);
          conversion_local = iVar1 + conversion_local;
        }
      }
      else if ((sym[4].kind & 4) == 0) {
        if (sym[5].ident == (fb_token_t *)&DAT_00000001) {
          local_184 = 0;
        }
        else {
          local_184 = nsc._4_4_;
        }
        if (local_184 == 1) {
          if ((int)nsc == 0) {
            fprintf((FILE *)ct_local->export_index,"%s_assign_from_pe(&p->%.*s, v%i)",auStack_158,
                    (ulong)s._4_4_,pcStack_58,(ulong)(uint)conversion_local);
          }
          else {
            in_stack_fffffffffffffe48 = pcStack_58;
            fprintf((FILE *)ct_local->export_index,"%s_copy_from_pe(&p->%.*s, &p2->%.*s)",
                    auStack_158,(ulong)s._4_4_,pcStack_58,(ulong)s._4_4_,pcStack_58);
          }
        }
        else if (local_184 == 2) {
          if ((int)nsc == 0) {
            fprintf((FILE *)ct_local->export_index,"%s_assign_to_pe(&p->%.*s, v%i)",auStack_158,
                    (ulong)s._4_4_,pcStack_58,(ulong)(uint)conversion_local);
          }
          else {
            in_stack_fffffffffffffe48 = pcStack_58;
            fprintf((FILE *)ct_local->export_index,"%s_copy_to_pe(&p->%.*s, &p2->%.*s)",auStack_158,
                    (ulong)s._4_4_,pcStack_58,(ulong)s._4_4_,pcStack_58);
          }
        }
        else if ((int)nsc == 0) {
          fprintf((FILE *)ct_local->export_index,"p->%.*s = v%i",(ulong)s._4_4_,pcStack_58,
                  (ulong)(uint)conversion_local);
        }
        else {
          fprintf((FILE *)ct_local->export_index,"p->%.*s = p2->%.*s",(ulong)s._4_4_,pcStack_58,
                  (ulong)s._4_4_,pcStack_58);
        }
        conversion_local = conversion_local + 1;
      }
      else {
        fprintf((FILE *)ct_local->export_index,"__%sstruct_clear_field(p->__deprecated%i)",member,
                (ulong)kind._4_4_);
        kind._4_4_ = kind._4_4_ + 1;
        conversion_local = conversion_local + 1;
      }
      break;
    case 0x11:
      snref._224_8_ = scalar_type_prefix(*(fb_scalar_type_t *)&sym[1].link);
      s._0_4_ = *(undefined4 *)&sym[1].field_0x14;
      if ((sym[4].kind & 4) == 0) {
        uVar2 = (undefined4)((ulong)in_stack_fffffffffffffe50 >> 0x20);
        in_stack_fffffffffffffe48 = pcStack_58;
        if ((int)nsc == 0) {
          in_stack_fffffffffffffe50 = (char *)CONCAT44(uVar2,conversion_local);
          in_stack_fffffffffffffe58 =
               (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffe58 >> 0x20),s._0_4_);
          fprintf((FILE *)ct_local->export_index,"%s%s_array_copy%s(p->%.*s, v%i, %d)",member,
                  snref._224_8_,tprefix,(ulong)s._4_4_,pcStack_58,in_stack_fffffffffffffe50,
                  in_stack_fffffffffffffe58);
        }
        else {
          in_stack_fffffffffffffe50 = (char *)CONCAT44(uVar2,s._4_4_);
          in_stack_fffffffffffffe58 = pcStack_58;
          fprintf((FILE *)ct_local->export_index,"%s%s_array_copy%s(p->%.*s, p2->%.*s, %d)",member,
                  snref._224_8_,tprefix,(ulong)s._4_4_,pcStack_58,in_stack_fffffffffffffe50,
                  pcStack_58,s._0_4_);
        }
        goto LAB_0010f560;
      }
      fprintf((FILE *)ct_local->export_index,"__%sstruct_clear_field(p->__deprecated%i)",member,
              (ulong)kind._4_4_);
      kind._4_4_ = kind._4_4_ + 1;
      conversion_local = conversion_local + 1;
      break;
    case 0x14:
      s._0_4_ = *(undefined4 *)&sym[1].field_0x14;
      fb_compound_name((fb_compound_type_t *)sym[1].link,(fb_scoped_name_t *)auStack_158);
      if ((sym[4].kind & 4) == 0) {
        uVar2 = (undefined4)((ulong)in_stack_fffffffffffffe48 >> 0x20);
        if ((int)nsc == 0) {
          in_stack_fffffffffffffe48 = (char *)CONCAT44(uVar2,conversion_local);
          in_stack_fffffffffffffe50 =
               (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffe50 >> 0x20),s._0_4_);
          fprintf((FILE *)ct_local->export_index,"%s_array_copy%s(p->%.*s, v%i, %d)",auStack_158,
                  tprefix,(ulong)s._4_4_,pcStack_58,in_stack_fffffffffffffe48,
                  in_stack_fffffffffffffe50);
        }
        else {
          in_stack_fffffffffffffe48 = (char *)CONCAT44(uVar2,s._4_4_);
          in_stack_fffffffffffffe58 =
               (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffe58 >> 0x20),s._0_4_);
          in_stack_fffffffffffffe50 = pcStack_58;
          fprintf((FILE *)ct_local->export_index,"%s_array_copy%s(p->%.*s, p2->%.*s, %d)",
                  auStack_158,tprefix,(ulong)s._4_4_,pcStack_58,in_stack_fffffffffffffe48,pcStack_58
                  ,in_stack_fffffffffffffe58);
        }
        conversion_local = conversion_local + 1;
      }
      else {
        fprintf((FILE *)ct_local->export_index,"__%sstruct_clear_field(p->__deprecated%i)",member,
                (ulong)kind._4_4_);
        kind._4_4_ = kind._4_4_ + 1;
        conversion_local = conversion_local + 1;
      }
    }
    _len = _len->link;
  } while( true );
}

Assistant:

static int gen_builder_struct_field_assign(fb_output_t *out, fb_compound_type_t *ct, int index, int arg_count,
        int conversion, int from_ptr)
{
    const char *nsc = out->nsc;
    fb_member_t *member;
    fb_symbol_t *sym;
    int n, len;
    const char *s;
    int deprecated_index = 0;
    const char *kind, *tprefix;
    fb_scoped_name_t snref;

    fb_clear(snref);
    switch (conversion) {
    case convert_to_pe: kind = "_to_pe"; break;
    case convert_from_pe: kind = "_from_pe"; break;
    default: kind = ""; break;
    }
    for (sym = ct->members; sym; sym = sym->link) {
        member = (fb_member_t *)sym;
        symbol_name(sym, &n, &s);

        if (index > 0) {
            if (index % 4 == 0) {
                fprintf(out->fp, ";\n  ");
            } else {
                fprintf(out->fp, "; ");
            }
        }
        switch (member->type.type) {
        case vt_fixed_array_compound_type_ref:
            len = (int)member->type.len;
            fb_compound_name(member->type.ct, &snref);
            if (member->metadata_flags & fb_f_deprecated) {
                fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                        nsc, deprecated_index);
                ++deprecated_index;
                ++index;
                continue;
            }
            if (from_ptr) {
                fprintf(out->fp, "%s_array_copy%s(p->%.*s, p2->%.*s, %d)",
                        snref.text, kind, n, s, n, s, len);
            } else {
                fprintf(out->fp, "%s_array_copy%s(p->%.*s, v%i, %d)",
                        snref.text, kind, n, s, index, len);
            }
            ++index;
            continue;
        case vt_compound_type_ref:
            fb_compound_name(member->type.ct, &snref);
            if (member->type.ct->symbol.kind == fb_is_struct) {
                if (member->metadata_flags & fb_f_deprecated) {
                    fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                            nsc, deprecated_index);
                    deprecated_index++;
                    index += get_total_struct_field_count(member->type.ct);
                    continue;
                }
                if (from_ptr) {
                    fprintf(out->fp, "%s_copy%s(&p->%.*s, &p2->%.*s)", snref.text, kind, n, s, n, s);
                    /* `index` does not count children, but it doesn't matter here. */
                    ++index;
                } else {
                    fprintf(out->fp, "%s_assign%s(&p->%.*s", snref.text, kind, n, s);
                    index = gen_builder_struct_call_list(out, member->type.ct, index, arg_count, 0);
                    fprintf(out->fp, ")");
                }
                continue;
            }
            if (member->metadata_flags & fb_f_deprecated) {
                fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                        nsc, deprecated_index);
                ++deprecated_index;
                ++index;
                continue;
            }
            switch (member->size == 1 ? no_conversion : conversion) {
            case convert_from_pe:
                if (from_ptr) {
                    fprintf(out->fp, "%s_copy_from_pe(&p->%.*s, &p2->%.*s)",
                            snref.text, n, s, n, s);
                } else {
                    fprintf(out->fp, "%s_assign_from_pe(&p->%.*s, v%i)",
                            snref.text, n, s, index);
                }
                break;
            case convert_to_pe:
                if (from_ptr) {
                    fprintf(out->fp, "%s_copy_to_pe(&p->%.*s, &p2->%.*s)",
                            snref.text, n, s, n, s);
                } else {
                    fprintf(out->fp, "%s_assign_to_pe(&p->%.*s, v%i)",
                            snref.text, n, s, index);
                }
                break;
            default:
                if (from_ptr) {
                    fprintf(out->fp, "p->%.*s = p2->%.*s", n, s, n, s);
                } else {
                    fprintf(out->fp, "p->%.*s = v%i", n, s, index);
                }
                break;
            }
            ++index;
            continue;
        case vt_fixed_array_type:
            tprefix = scalar_type_prefix(member->type.st);
            len = (int)member->type.len;
            if (member->metadata_flags & fb_f_deprecated) {
                fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                        nsc, deprecated_index);
                ++deprecated_index;
                ++index;
                continue;
            }
            if (from_ptr) {
                fprintf(out->fp, "%s%s_array_copy%s(p->%.*s, p2->%.*s, %d)",
                        nsc, tprefix, kind, n, s, n, s, len);
            } else {
                fprintf(out->fp, "%s%s_array_copy%s(p->%.*s, v%i, %d)",
                        nsc, tprefix, kind, n, s, index, len);
            }
            ++index;
            break;
        case vt_scalar_type:
            tprefix = scalar_type_prefix(member->type.st);
            if (member->metadata_flags & fb_f_deprecated) {
                fprintf(out->fp, "__%sstruct_clear_field(p->__deprecated%i)",
                        nsc, deprecated_index);
                ++deprecated_index;
                ++index;
                continue;
            }
            switch (member->size == 1 ? no_conversion : conversion) {
            case convert_from_pe:
                if (from_ptr) {
                    fprintf(out->fp, "%s%s_copy_from_pe(&p->%.*s, &p2->%.*s)",
                            nsc, tprefix, n, s, n, s);
                } else {
                    fprintf(out->fp, "%s%s_assign_from_pe(&p->%.*s, v%i)",
                            nsc, tprefix, n, s, index);
                }
                break;
            case convert_to_pe:
                if (from_ptr) {
                    fprintf(out->fp, "%s%s_copy_to_pe(&p->%.*s, &p2->%.*s)",
                            nsc, tprefix, n, s, n, s);
                } else {
                    fprintf(out->fp, "%s%s_assign_to_pe(&p->%.*s, v%i)",
                            nsc, tprefix, n, s, index);
                }
                break;
            default:
                if (from_ptr) {
                    fprintf(out->fp, "p->%.*s = p2->%.*s", n, s, n, s);
                } else {
                    fprintf(out->fp, "p->%.*s = v%i", n, s, index);
                }
                break;
            }
            ++index;
            break;
        default:
            gen_panic(out, "internal error: type error");
            continue;
        }
    }
    if (arg_count > 0) {
        fprintf(out->fp, ";\n  ");
    }
    return index;
}